

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.h
# Opt level: O0

pair<unsigned_long,_unsigned_long> __thiscall
trieste::SourceDef::linecol(SourceDef *this,size_t pos)

{
  bool bVar1;
  reference puVar2;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_68;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60;
  unsigned_long *local_58;
  size_t col;
  difference_type local_48;
  difference_type line;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_30;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  it;
  size_t pos_local;
  SourceDef *this_local;
  
  it._M_current = (unsigned_long *)pos;
  local_38._M_current =
       (unsigned_long *)
       CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->lines);
  line = (difference_type)
         CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->lines);
  local_30 = std::
             lower_bound<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                       (local_38,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )line,(unsigned_long *)&it);
  col = (size_t)CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->lines);
  local_48 = __gnu_cxx::operator-
                       (&local_30,
                        (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         *)&col);
  local_58 = it._M_current;
  local_60._M_current =
       (unsigned_long *)
       CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->lines);
  bVar1 = __gnu_cxx::
          operator==<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    (&local_30,&local_60);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_68 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator-(&local_30,1);
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_68);
    local_58 = (unsigned_long *)((long)local_58 - (*puVar2 + 1));
  }
  CLI::std::pair<unsigned_long,_unsigned_long>::pair<long_&,_unsigned_long_&,_true>
            ((pair<unsigned_long,_unsigned_long> *)&this_local,&local_48,(unsigned_long *)&local_58)
  ;
  return _this_local;
}

Assistant:

std::pair<size_t, size_t> linecol(size_t pos) const
    {
      // Lines and columns are 0-indexed.
      auto it = std::lower_bound(lines.begin(), lines.end(), pos);

      auto line = it - lines.begin();
      auto col = pos;

      if (it != lines.begin())
        col -= *(it - 1) + 1;

      return {line, col};
    }